

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  environment env;
  Session session;
  environment local_1a4;
  Session local_1a0;
  
  diy::mpi::environment::environment(&local_1a4);
  Catch::Session::Session(&local_1a0);
  iVar1 = Catch::Session::run<char>(&local_1a0,argc,argv);
  Catch::Session::~Session(&local_1a0);
  diy::mpi::environment::~environment(&local_1a4);
  return iVar1;
}

Assistant:

int main(int argc, char** argv)
{
  diy::mpi::environment env;

  Catch::Session session;
  return session.run(argc, argv);
}